

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadedObjectTest::MultiThreadedObjectTest
          (MultiThreadedObjectTest *this,EglTestContext *context,char *name,char *description,
          deUint32 type)

{
  deUint32 type_local;
  char *description_local;
  char *name_local;
  EglTestContext *context_local;
  MultiThreadedObjectTest *this_local;
  
  MultiThreadedTest::MultiThreadedTest
            (&this->super_MultiThreadedTest,context,name,description,2,20000000);
  (this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiThreadedObjectTest_006716f0;
  this->m_config = (EGLConfig)0x0;
  de::Random::Random(&this->m_rnd0,0x37820a7);
  de::Random::Random(&this->m_rnd1,0x38647);
  this->m_types = type;
  this->m_hasWindow = 0;
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::vector(&this->m_sharedNativePixmaps);
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::vector(&this->m_nativePixmaps0);
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::vector(&this->m_nativePixmaps1);
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::vector(&this->m_sharedNativeWindows);
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::vector(&this->m_nativeWindows0);
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::vector(&this->m_nativeWindows1);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_sharedPbuffers);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_pbuffers0);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_pbuffers1);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_sharedContexts);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_contexts0);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_contexts1);
  return;
}

Assistant:

MultiThreadedObjectTest::MultiThreadedObjectTest (EglTestContext& context, const char* name, const char* description, deUint32 type)
	: MultiThreadedTest (context, name, description, 2, 20000000/*us = 20s*/) // \todo [mika] Set timeout to something relevant to frameworks timeout?
	, m_config			(DE_NULL)
	, m_rnd0			(58204327)
	, m_rnd1			(230983)
	, m_types			((Type)type)
	, m_hasWindow		(0)
{
}